

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O1

void mult_verify::MultVerifyInt64Int(void)

{
  return;
}

Assistant:

void MultVerifyInt64Int()
{
	TestVector< std::int64_t, std::int64_t, OpType::Mult > tests;
	TestCase<std::int64_t, std::int64_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::int64_t ret;
		if( SafeMultiply(test.x, test.y, ret) != test.fExpected )
		{
			//assert(false);
			err_msg( "Error in case int64_int32: ", test.x, test.y, test.fExpected );
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::int64_t> si(test.x);
			si *= test.y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != test.fExpected )
		{
			err_msg( "Error in case int64_int32 throw: ", test.x, test.y, test.fExpected );
		}

		test = tests.GetNext();
	}
}